

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O0

void secp256k1_scalar_cadd_bit(secp256k1_scalar *r,uint bit,int flag)

{
  uint64_t uVar1;
  int in_EDX;
  int in_ESI;
  secp256k1_scalar *in_RDI;
  int vflag;
  secp256k1_uint128 t;
  secp256k1_uint128 local_28;
  uint local_c;
  secp256k1_scalar *local_8;
  
  local_c = in_ESI;
  local_8 = in_RDI;
  secp256k1_scalar_verify(in_RDI);
  local_c = (in_EDX - 1U & 0x100) + local_c;
  secp256k1_u128_from_u64(&local_28,local_8->d[0]);
  secp256k1_u128_accum_u64(&local_28,(long)(int)(uint)(local_c >> 6 == 0) << ((byte)local_c & 0x3f))
  ;
  uVar1 = secp256k1_u128_to_u64(&local_28);
  local_8->d[0] = uVar1;
  secp256k1_u128_rshift(&local_28,0x40);
  secp256k1_u128_accum_u64(&local_28,local_8->d[1]);
  secp256k1_u128_accum_u64(&local_28,(long)(int)(uint)(local_c >> 6 == 1) << ((byte)local_c & 0x3f))
  ;
  uVar1 = secp256k1_u128_to_u64(&local_28);
  local_8->d[1] = uVar1;
  secp256k1_u128_rshift(&local_28,0x40);
  secp256k1_u128_accum_u64(&local_28,local_8->d[2]);
  secp256k1_u128_accum_u64(&local_28,(long)(int)(uint)(local_c >> 6 == 2) << ((byte)local_c & 0x3f))
  ;
  uVar1 = secp256k1_u128_to_u64(&local_28);
  local_8->d[2] = uVar1;
  secp256k1_u128_rshift(&local_28,0x40);
  secp256k1_u128_accum_u64(&local_28,local_8->d[3]);
  secp256k1_u128_accum_u64(&local_28,(long)(int)(uint)(local_c >> 6 == 3) << ((byte)local_c & 0x3f))
  ;
  uVar1 = secp256k1_u128_to_u64(&local_28);
  local_8->d[3] = uVar1;
  secp256k1_scalar_verify(local_8);
  return;
}

Assistant:

static void secp256k1_scalar_cadd_bit(secp256k1_scalar *r, unsigned int bit, int flag) {
    secp256k1_uint128 t;
    volatile int vflag = flag;
    SECP256K1_SCALAR_VERIFY(r);
    VERIFY_CHECK(bit < 256);

    bit += ((uint32_t) vflag - 1) & 0x100;  /* forcing (bit >> 6) > 3 makes this a noop */
    secp256k1_u128_from_u64(&t, r->d[0]);
    secp256k1_u128_accum_u64(&t, ((uint64_t)((bit >> 6) == 0)) << (bit & 0x3F));
    r->d[0] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, r->d[1]);
    secp256k1_u128_accum_u64(&t, ((uint64_t)((bit >> 6) == 1)) << (bit & 0x3F));
    r->d[1] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, r->d[2]);
    secp256k1_u128_accum_u64(&t, ((uint64_t)((bit >> 6) == 2)) << (bit & 0x3F));
    r->d[2] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, r->d[3]);
    secp256k1_u128_accum_u64(&t, ((uint64_t)((bit >> 6) == 3)) << (bit & 0x3F));
    r->d[3] = secp256k1_u128_to_u64(&t);

    SECP256K1_SCALAR_VERIFY(r);
    VERIFY_CHECK(secp256k1_u128_hi_u64(&t) == 0);
}